

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_udp.c
# Opt level: O0

void * csp_if_udp_rx_loop(void *param)

{
  long lVar1;
  int iVar2;
  long in_RDI;
  int ret;
  sockaddr_in server_addr;
  csp_if_udp_conf_t *ifconf;
  csp_iface_t *iface;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  sa_family_t in_stack_ffffffffffffffd8;
  uint16_t in_stack_ffffffffffffffda;
  uint32_t in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_RDI + 0x18);
  while (*(int *)(lVar1 + 0x28) == 0) {
    iVar2 = socket(2,2,0x11);
    *(int *)(lVar1 + 0x28) = iVar2;
    memset(&stack0xffffffffffffffd8,0,0x10);
    in_stack_ffffffffffffffd8 = 2;
    in_stack_ffffffffffffffdc = htonl(0);
    in_stack_ffffffffffffffda = htons((uint16_t)*(undefined4 *)(lVar1 + 8));
    bind(*(int *)(lVar1 + 0x28),(sockaddr *)&stack0xffffffffffffffd8,0x10);
    if (-1 < *(int *)(lVar1 + 0x28)) break;
    csp_print_func("  UDP server waiting for port %d\n",(ulong)*(uint *)(lVar1 + 8));
    sleep(1);
  }
  do {
    do {
      while (in_stack_ffffffffffffffd4 =
                  csp_if_udp_rx_work(in_stack_ffffffffffffffe0,
                                     CONCAT44(in_stack_ffffffffffffffdc,
                                              CONCAT22(in_stack_ffffffffffffffda,
                                                       in_stack_ffffffffffffffd8)),
                                     (csp_iface_t *)
                                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
            in_stack_ffffffffffffffd4 == -2) {
        *(int *)(in_RDI + 0x38) = *(int *)(in_RDI + 0x38) + 1;
      }
    } while (in_stack_ffffffffffffffd4 != -1);
    usleep(10000);
  } while( true );
}

Assistant:

void * csp_if_udp_rx_loop(void * param) {

	csp_iface_t * iface = param;
	csp_if_udp_conf_t * ifconf = iface->driver_data;

	while (ifconf->sockfd == 0) {

		ifconf->sockfd = socket(AF_INET, SOCK_DGRAM, PF_PACKET);

		struct sockaddr_in server_addr = {0};
		server_addr.sin_family = AF_INET;
		server_addr.sin_addr.s_addr = htonl(INADDR_ANY);
		server_addr.sin_port = htons(ifconf->lport);

		bind(ifconf->sockfd, (struct sockaddr *)&server_addr, sizeof(server_addr));

		if (ifconf->sockfd < 0) {
			csp_print("  UDP server waiting for port %d\n", ifconf->lport);
			sleep(1);
			continue;
		}
		break;
	}

	while (1) {
		int ret;
		ret = csp_if_udp_rx_work(ifconf->sockfd, 0, iface);
		if (ret == CSP_ERR_INVAL) {
			iface->rx_error++;
		} else if (ret == CSP_ERR_NOMEM) {
			usleep(10000);
		}
	}

	return NULL;
}